

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_manyvec.c
# Opt level: O3

int main(void)

{
  double dVar1;
  long lVar2;
  uint uVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  FILE *pFVar9;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  SUNContext ctx;
  sunrealtype t;
  void *arkode_mem;
  long netf;
  long ncfn;
  long nni;
  long nfeLS;
  long nJv;
  long nlcf;
  long nli;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  N_Vector uvw [3];
  undefined8 local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  double local_e8;
  double local_e0;
  undefined8 local_d8;
  long local_d0;
  long local_c8;
  undefined8 *local_c0;
  long local_b8;
  ulong local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_d0 = 0;
  uVar3 = SUNContext_Create(0,&local_128);
  if ((int)uVar3 < 0) {
    pcVar10 = "SUNContext_Create";
  }
  else {
    puVar4 = (undefined8 *)malloc(0x40);
    if (puVar4 == (undefined8 *)0x0) {
      main_cold_10();
      return 1;
    }
    *puVar4 = 0xc9;
    puVar4[2] = 0x3fe3333333333333;
    puVar4[3] = 0x4000000000000000;
    puVar4[4] = 0x3f50624dd2f1a9fc;
    puVar4[5] = 0x3f50624dd2f1a9fc;
    puVar4[6] = 0x3f50624dd2f1a9fc;
    puVar4[7] = 0x3ee4f8b588e368f1;
    puts("\n1D Brusselator PDE test problem:");
    printf("    N = %li\n",*puVar4);
    printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",(int)puVar4[2],puVar4[3],puVar4[7]
          );
    printf("    diffusion coefficients:  du = %g,  dv = %g,  dw = %g\n",(int)puVar4[4],puVar4[5],
           puVar4[6]);
    printf("    reltol = %.1e,  abstol = %.1e\n\n",0xa0b5ed8d,0x3ddb7cdfd9d7bdbb);
    puVar4[1] = 0x3f747ae147ae147b;
    lVar5 = N_VNew_Serial(0xc9,local_128);
    if (lVar5 == 0) {
      main_cold_9();
      return 1;
    }
    local_118 = N_VClone(lVar5);
    if (local_118 == 0) {
      main_cold_8();
      return 1;
    }
    lVar6 = N_VClone(lVar5);
    if (lVar6 == 0) {
      main_cold_7();
      return 1;
    }
    local_40 = local_118;
    local_48 = lVar5;
    local_38 = lVar6;
    local_120 = N_VNew_ManyVector(3,&local_48,local_128);
    if (local_120 == 0) {
      main_cold_6();
      return 1;
    }
    lVar7 = N_VGetArrayPointer(lVar5);
    if (lVar7 == 0) {
      main_cold_5();
      return 1;
    }
    local_108 = N_VGetArrayPointer(local_118);
    if (local_108 == 0) {
      main_cold_4();
      return 1;
    }
    lVar8 = N_VGetArrayPointer(lVar6);
    lVar2 = local_108;
    local_110 = lVar8;
    if (lVar8 == 0) {
      main_cold_3();
      return 1;
    }
    lVar11 = 0;
    local_f0 = lVar6;
    do {
      dVar13 = (double)lVar11 * 3.141592653589793;
      dVar1 = sin((double)puVar4[1] * dVar13);
      *(double *)(lVar7 + lVar11 * 8) = dVar1 * 0.1 + 0.6;
      dVar1 = sin((double)puVar4[1] * dVar13);
      *(double *)(lVar2 + lVar11 * 8) = dVar1 * 0.1 + 3.3333333333333335;
      dVar1 = sin(dVar13 * (double)puVar4[1]);
      *(double *)(lVar8 + lVar11 * 8) = dVar1 * 0.1 + 2.0;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0xc9);
    local_f8 = lVar7;
    lVar6 = ARKStepCreate(0,fe,fi,local_120,local_128);
    local_d0 = lVar6;
    if (lVar6 == 0) {
      main_cold_2();
      return 1;
    }
    uVar3 = ARKodeSetUserData(lVar6,puVar4);
    if ((int)uVar3 < 0) {
      pcVar10 = "ARKodeSetUserData";
    }
    else {
      uVar3 = ARKodeSStolerances(0xa0b5ed8d,0x3ddb7cdfd9d7bdbb,lVar6);
      if ((int)uVar3 < 0) {
        pcVar10 = "ARKodeSStolerances";
      }
      else {
        lVar7 = SUNLinSol_SPGMR(local_120,0,10,local_128);
        if (lVar7 == 0) {
          main_cold_1();
          return 1;
        }
        uVar3 = ARKodeSetLinearSolver(lVar6,lVar7,0);
        if ((int)uVar3 < 0) {
          pcVar10 = "ARKodeSetLinearSolver";
        }
        else {
          uVar3 = ARKodeSetJacTimes(lVar6,0,JacVI);
          if (-1 < (int)uVar3) {
            local_100 = lVar6;
            local_c8 = lVar7;
            pFVar9 = fopen("bruss_mesh.txt","w");
            lVar6 = 0;
            do {
              fprintf(pFVar9,"  %.16e\n",SUB84((double)lVar6 * (double)puVar4[1],0));
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0xc9);
            local_c0 = puVar4;
            fclose(pFVar9);
            pFVar9 = fopen("bruss_u.txt","w");
            __stream = fopen("bruss_v.txt","w");
            __stream_00 = fopen("bruss_w.txt","w");
            lVar6 = local_f8;
            lVar7 = 0;
            do {
              fprintf(pFVar9," %.16e",(int)*(undefined8 *)(lVar6 + lVar7 * 8));
              lVar2 = local_108;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 0xc9);
            lVar6 = 0;
            do {
              fprintf(__stream," %.16e",(int)*(undefined8 *)(lVar2 + lVar6 * 8));
              lVar7 = local_110;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0xc9);
            lVar6 = 0;
            do {
              fprintf(__stream_00," %.16e",(int)*(undefined8 *)(lVar7 + lVar6 * 8));
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0xc9);
            fputc(10,pFVar9);
            fputc(10,__stream);
            fputc(10,__stream_00);
            local_d8 = 0;
            puts("        t      ||u||_rms   ||v||_rms   ||w||_rms");
            puts("   ----------------------------------------------");
            uVar12 = 0;
            dVar1 = 0.1;
            local_b8 = lVar5;
            do {
              lVar5 = local_b8;
              uVar3 = ARKodeEvolve(local_100,local_120,&local_d8,1);
              if ((int)uVar3 < 0) {
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeEvolve",
                        (ulong)uVar3);
                break;
              }
              dVar13 = (double)N_VDotProd(lVar5,lVar5);
              dVar13 = dVar13 / 201.0;
              if (dVar13 < 0.0) {
                local_e0 = sqrt(dVar13);
              }
              else {
                local_e0 = SQRT(dVar13);
              }
              dVar13 = (double)N_VDotProd(local_118,local_118);
              dVar13 = dVar13 / 201.0;
              if (dVar13 < 0.0) {
                local_e8 = sqrt(dVar13);
              }
              else {
                local_e8 = SQRT(dVar13);
              }
              dVar13 = (double)N_VDotProd(local_f0,local_f0);
              dVar13 = dVar13 / 201.0;
              local_b0 = uVar12;
              if (dVar13 < 0.0) {
                dVar13 = sqrt(dVar13);
              }
              else {
                dVar13 = SQRT(dVar13);
              }
              printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",(int)local_d8,local_e0,local_e8,dVar13);
              lVar5 = local_f8;
              dVar13 = dVar1 + 0.1;
              lVar6 = 0;
              do {
                fprintf(pFVar9," %.16e",(int)*(undefined8 *)(lVar5 + lVar6 * 8));
                lVar7 = local_108;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 0xc9);
              lVar5 = 0;
              do {
                fprintf(__stream," %.16e",(int)*(undefined8 *)(lVar7 + lVar5 * 8));
                lVar6 = local_110;
                lVar5 = lVar5 + 1;
              } while (lVar5 != 0xc9);
              lVar5 = 0;
              do {
                fprintf(__stream_00," %.16e",(int)*(undefined8 *)(lVar6 + lVar5 * 8));
                lVar5 = lVar5 + 1;
              } while (lVar5 != 0xc9);
              dVar1 = 10.0;
              if (dVar13 <= 10.0) {
                dVar1 = dVar13;
              }
              fputc(10,pFVar9);
              fputc(10,__stream);
              fputc(10,__stream_00);
              uVar3 = (int)local_b0 + 1;
              uVar12 = (ulong)uVar3;
              lVar5 = local_b8;
            } while (uVar3 != 100);
            puts("   ----------------------------------------------");
            fclose(pFVar9);
            fclose(__stream);
            fclose(__stream_00);
            lVar6 = local_100;
            uVar3 = ARKodeGetNumSteps(local_100,&local_50);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeGetNumSteps"
                      ,(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumStepAttempts(lVar6,&local_58);
            puVar4 = local_c0;
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumStepAttempts",(ulong)uVar3);
            }
            uVar3 = ARKStepGetNumRhsEvals(lVar6,&local_60,&local_68);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKStepGetNumRhsEvals",(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumLinSolvSetups(lVar6,&local_70);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumLinSolvSetups",(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumErrTestFails(lVar6,&local_a8);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumErrTestFails",(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumNonlinSolvIters(lVar6,&local_98);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumNonlinSolvIters",(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumNonlinSolvConvFails(lVar6,&local_a0);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumNonlinSolvConvFails",(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumLinIters(lVar6,&local_78);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumLinIters",(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumLinConvFails(lVar6,&local_80);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumLinConvFails",(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumJtimesEvals(lVar6,&local_88);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumJtimesEvals",(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumLinRhsEvals(lVar6,&local_90);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumLinRhsEvals",(ulong)uVar3);
            }
            puts("\nFinal Solver Statistics:");
            printf("   Internal solver steps = %li (attempted = %li)\n",local_50,local_58);
            printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_60,local_68);
            printf("   Total linear solver setups = %li\n",local_70);
            printf("   Total linear iterations = %li\n",local_78);
            printf("   Total linear convergence failures = %li\n",local_80);
            printf("   Total J*v evaluations = %li\n",local_88);
            printf("   Total RHS evals in linear solver = %li\n",local_90);
            printf("   Total number of Newton iterations = %li\n",local_98);
            printf("   Total number of nonlinear solver convergence failures = %li\n",local_a0);
            printf("   Total number of error test failures = %li\n\n",local_a8);
            N_VDestroy(local_120);
            N_VDestroy(lVar5);
            N_VDestroy(local_118);
            N_VDestroy(local_f0);
            free(puVar4);
            ARKodeFree(&local_d0);
            SUNLinSolFree(local_c8);
            SUNContext_Free(&local_128);
            return 0;
          }
          pcVar10 = "ARKodeSetJacTimes";
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar10,(ulong)uVar3);
  return 1;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = ZERO;             /* initial time */
  sunrealtype Tf    = SUN_RCONST(10.0); /* final time */
  int Nt            = 100;              /* total number of output times */
  int Nvar          = 3;                /* number of solution fields */
  UserData userdata = NULL;
  sunrealtype *udata, *vdata, *wdata;
  sunindextype N     = 201;             /* spatial mesh size */
  sunrealtype a      = SUN_RCONST(0.6); /* problem parameters */
  sunrealtype b      = SUN_RCONST(2.0);
  sunrealtype du     = SUN_RCONST(0.001);
  sunrealtype dv     = SUN_RCONST(0.001);
  sunrealtype dw     = SUN_RCONST(0.001);
  sunrealtype ep     = SUN_RCONST(1.0e-5); /* stiffness parameter */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-10);
  sunindextype i;

  /* general problem variables */
  int flag;          /* reusable error-checking flag */
  N_Vector y = NULL; /* empty manyvector for storing solution */
  N_Vector u = NULL; /* empty vectors for storing solution components */
  N_Vector v = NULL;
  N_Vector w = NULL;
  N_Vector uvw[3]; /* vector array composed of u,v,w component vectors */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  sunrealtype pi, t, dTout, tout, unorm, vnorm, wnorm;
  FILE *FID, *UFID, *VFID, *WFID;
  int iout;
  long int nst, nst_a, nfe, nfi, nsetups, nli, nlcf, nJv, nfeLS, nni, ncfn, netf;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* allocate udata structure */
  userdata = (UserData)malloc(sizeof(*userdata));
  if (check_flag((void*)userdata, "malloc", 2)) { return 1; }

  /* store the inputs in the UserData structure */
  userdata->N  = N;
  userdata->a  = a;
  userdata->b  = b;
  userdata->du = du;
  userdata->dv = dv;
  userdata->dw = dw;
  userdata->ep = ep;

  /* Initial problem output */
  printf("\n1D Brusselator PDE test problem:\n");
  printf("    N = %li\n", (long int)userdata->N);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         userdata->a, userdata->b, userdata->ep);
  printf("    diffusion coefficients:  du = %" GSYM ",  dv = %" GSYM
         ",  dw = %" GSYM "\n",
         userdata->du, userdata->dv, userdata->dw);
  printf("    reltol = %.1" ESYM ",  abstol = %.1" ESYM "\n\n", reltol, abstol);

  /* Initialize data structures */
  userdata->dx = ONE / (N - 1);         /* set spatial mesh spacing */
  u            = N_VNew_Serial(N, ctx); /* Create serial vectors */
  if (check_flag((void*)u, "N_VNew_Serial", 0)) { return 1; }
  v = N_VClone(u);
  if (check_flag((void*)v, "N_VClone", 0)) { return 1; }
  w = N_VClone(u);
  if (check_flag((void*)w, "N_VClone", 0)) { return 1; }

  /* Create manyvector for solution */
  uvw[0] = u;
  uvw[1] = v;
  uvw[2] = w;
  y      = N_VNew_ManyVector(Nvar, uvw, ctx);
  if (check_flag((void*)y, "N_VNew_ManyVector", 0)) { return 1; }

  udata = N_VGetArrayPointer(u); /* Access data array for new NVector u */
  if (check_flag((void*)udata, "N_VGetArrayPointer", 0)) { return 1; }
  vdata = N_VGetArrayPointer(v); /* Access data array for new NVector v */
  if (check_flag((void*)vdata, "N_VGetArrayPointer", 0)) { return 1; }
  wdata = N_VGetArrayPointer(w); /* Access data array for new NVector w */
  if (check_flag((void*)wdata, "N_VGetArrayPointer", 0)) { return 1; }

  /* Set initial conditions into y */
  pi = SUN_RCONST(4.0) * atan(ONE);
  for (i = 0; i < N; i++)
  {
    udata[i] = a + SUN_RCONST(0.1) * sin(pi * i * userdata->dx);     /* u */
    vdata[i] = b / a + SUN_RCONST(0.1) * sin(pi * i * userdata->dx); /* v */
    wdata[i] = b + SUN_RCONST(0.1) * sin(pi * i * userdata->dx);     /* w */
  }

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(fe, fi, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)userdata); /* Pass udata to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  /* Initialize spgmr solver */
  LS = SUNLinSol_SPGMR(y, SUN_PREC_NONE, 10, ctx);
  if (check_flag((void*)LS, "SUNLinSol_SPGMR", 0)) { return 1; }

  /* Linear solver interface */
  flag = ARKodeSetLinearSolver(arkode_mem, LS, NULL); /* Attach linear solver */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacTimes(arkode_mem, NULL,
                           JacVI); /* Set the Jacobian-vector product */
  if (check_flag(&flag, "ARKodeSetJacTimes", 1)) { return 1; }

  /* output spatial mesh to disk */
  FID = fopen("bruss_mesh.txt", "w");
  for (i = 0; i < N; i++)
  {
    fprintf(FID, "  %.16" ESYM "\n", userdata->dx * i);
  }
  fclose(FID);

  /* Open output streams for results, access data array */
  UFID = fopen("bruss_u.txt", "w");
  VFID = fopen("bruss_v.txt", "w");
  WFID = fopen("bruss_w.txt", "w");

  /* output initial condition to disk */
  for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", udata[i]); }
  for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM "", vdata[i]); }
  for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM "", wdata[i]); }
  fprintf(UFID, "\n");
  fprintf(VFID, "\n");
  fprintf(WFID, "\n");

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t     = T0;
  dTout = (Tf - T0) / Nt;
  tout  = T0 + dTout;
  printf("        t      ||u||_rms   ||v||_rms   ||w||_rms\n");
  printf("   ----------------------------------------------\n");
  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }

    /* print solution statistics */
    unorm = N_VDotProd(u, u);
    unorm = sqrt(unorm / N);
    vnorm = N_VDotProd(v, v);
    vnorm = sqrt(vnorm / N);
    wnorm = N_VDotProd(w, w);
    wnorm = sqrt(wnorm / N);
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
           unorm, vnorm, wnorm);

    /* check integrator flag */
    if (flag >= 0)
    { /* successful solve: update output time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }

    /* output results to disk */
    for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", udata[i]); }
    for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM "", vdata[i]); }
    for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM "", wdata[i]); }
    fprintf(UFID, "\n");
    fprintf(VFID, "\n");
    fprintf(WFID, "\n");
  }
  printf("   ----------------------------------------------\n");
  fclose(UFID);
  fclose(VFID);
  fclose(WFID);

  /* Print some final statistics */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);
  flag = ARKodeGetNumLinIters(arkode_mem, &nli);
  check_flag(&flag, "ARKodeGetNumLinIters", 1);
  flag = ARKodeGetNumLinConvFails(arkode_mem, &nlcf);
  check_flag(&flag, "ARKodeGetNumLinConvFails", 1);
  flag = ARKodeGetNumJtimesEvals(arkode_mem, &nJv);
  check_flag(&flag, "ARKodeGetNumJtimesEvals", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total linear iterations = %li\n", nli);
  printf("   Total linear convergence failures = %li\n", nlcf);
  printf("   Total J*v evaluations = %li\n", nJv);
  printf("   Total RHS evals in linear solver = %li\n", nfeLS);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n",
         ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* Clean up and return with successful completion */
  N_VDestroy(y); /* Free vectors */
  N_VDestroy(u);
  N_VDestroy(v);
  N_VDestroy(w);
  free(userdata);          /* Free user data */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}